

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O2

void __thiscall tst_qpromise_operators::equalTo_void(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  bool bVar2;
  QPromise<void> p2;
  QPromise<void> p3;
  QPromise<void> p1;
  QPromise<void> p0;
  bool local_4a;
  bool local_49;
  QPromiseBase<void> local_48;
  QPromiseBase<void> local_38;
  QPromiseBase<void> local_28;
  QPromiseBase<void> local_18;
  
  QtPromise::QPromise<void>::resolve();
  QtPromise::QPromise<void>::resolve();
  local_48.m_d.d = local_28.m_d.d;
  if (local_28.m_d.d == (PromiseData<void> *)0x0) {
    local_38.m_d.d = (PromiseData<void> *)0x0;
  }
  else {
    LOCK();
    pQVar1 = &((local_28.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_38.m_d.d = local_28.m_d.d;
  }
  local_48._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119a98;
  if (local_38.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_38.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_49 = local_18.m_d.d == local_28.m_d.d;
  local_38._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00119a98;
  local_4a = false;
  bVar2 = QTest::qCompare<bool,bool>
                    (&local_49,&local_4a,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0xa8);
  if (bVar2) {
    local_49 = local_18.m_d.d == local_48.m_d.d;
    local_4a = false;
    bVar2 = QTest::qCompare<bool,bool>
                      (&local_49,&local_4a,"p0 == p2","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0xa9);
    if (bVar2) {
      local_49 = local_18.m_d.d == local_38.m_d.d;
      local_4a = false;
      bVar2 = QTest::qCompare<bool,bool>
                        (&local_49,&local_4a,"p0 == p3","false",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0xaa);
      if (bVar2) {
        local_49 = local_28.m_d.d == local_48.m_d.d;
        local_4a = true;
        bVar2 = QTest::qCompare<bool,bool>
                          (&local_49,&local_4a,"p1 == p2","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0xab);
        if (bVar2) {
          local_49 = local_28.m_d.d == local_38.m_d.d;
          local_4a = true;
          bVar2 = QTest::qCompare<bool,bool>
                            (&local_49,&local_4a,"p1 == p3","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0xac);
          if (bVar2) {
            local_49 = local_48.m_d.d == local_38.m_d.d;
            local_4a = true;
            QTest::qCompare<bool,bool>
                      (&local_49,&local_4a,"p2 == p3","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0xad);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_38);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_48);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_28);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_18);
  return;
}

Assistant:

void tst_qpromise_operators::equalTo_void()
{
    auto p0 = QtPromise::QPromise<void>::resolve();
    auto p1 = QtPromise::QPromise<void>::resolve();
    auto p2 = p1;
    auto p3(p2);

    QCOMPARE(p0 == p1, false);
    QCOMPARE(p0 == p2, false);
    QCOMPARE(p0 == p3, false);
    QCOMPARE(p1 == p2, true);
    QCOMPARE(p1 == p3, true);
    QCOMPARE(p2 == p3, true);
}